

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LineRecord2.cpp
# Opt level: O2

KString * __thiscall
KDIS::DATA_TYPE::LineRecord2::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,LineRecord2 *this)

{
  ostream *poVar1;
  KStringStream ss;
  KString local_200;
  KString local_1e0;
  KString local_1c0;
  stringstream local_1a0 [16];
  ostream local_190 [376];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  LineRecord1::GetAsString_abi_cxx11_(&local_1c0,&this->super_LineRecord1);
  poVar1 = std::operator<<(local_190,(string *)&local_1c0);
  poVar1 = std::operator<<(poVar1,"\tStart Velocity(m/s): ");
  Vector::GetAsString_abi_cxx11_(&local_1e0,&this->m_StartVel);
  poVar1 = std::operator<<(poVar1,(string *)&local_1e0);
  poVar1 = std::operator<<(poVar1,"\tEnd Velocity(m/s):   ");
  Vector::GetAsString_abi_cxx11_(&local_200,&this->m_EndVel);
  std::operator<<(poVar1,(string *)&local_200);
  std::__cxx11::string::~string((string *)&local_200);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString LineRecord2::GetAsString() const
{
    KStringStream ss;

    ss << LineRecord1::GetAsString()
       << "\tStart Velocity(m/s): " <<  m_StartVel.GetAsString()
       << "\tEnd Velocity(m/s):   " <<  m_EndVel.GetAsString();

    return ss.str();
}